

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckVars(SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this,SolCheck *chk)

{
  Violation viol;
  Violation viol_00;
  Violation viol_01;
  bool bVar1;
  int iVar2;
  reference nm;
  int iVar3;
  SolCheck *in_RSI;
  long in_RDI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *__x;
  double epsrel;
  double epsabs;
  bool aux;
  double x;
  int i;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff50;
  reference in_stack_ffffffffffffff58;
  FlatModel<mp::DefaultFlatModelParams> *in_stack_ffffffffffffff60;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff80;
  reference in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  int local_14;
  
  local_14 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::num_vars((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)0x15f960);
  while (iVar3 = local_14 + -1, local_14 != 0) {
    __x = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *)SolCheck::x((SolCheck *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    iVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::is_var_original(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_14 = iVar3;
    if ((iVar2 != 0) || (bVar1 = SolCheck::if_recomputed(in_RSI), !bVar1)) {
      SolCheck::VarViolBnds(in_RSI);
      nm = std::array<mp::ViolSummary,_2UL>::at
                     ((array<mp::ViolSummary,_2UL> *)in_stack_ffffffffffffff50,
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::lb(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::lb(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      epsrel = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::sol_feas_tol((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                               *)(in_RDI + -0x250));
      epsabs = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::sol_feas_tol_rel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                   *)(in_RDI + -0x250));
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::GetModel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)(in_RDI + -0x250));
      FlatModel<mp::DefaultFlatModelParams>::var_name
                (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      viol.valX_ = in_stack_ffffffffffffff90;
      viol.viol_ = (double)in_stack_ffffffffffffff88;
      ViolSummary::CheckViol((ViolSummary *)in_stack_ffffffffffffff80,viol,epsabs,epsrel,(char *)nm)
      ;
      SolCheck::VarViolBnds(in_RSI);
      in_stack_ffffffffffffff88 =
           std::array<mp::ViolSummary,_2UL>::at
                     ((array<mp::ViolSummary,_2UL> *)in_stack_ffffffffffffff50,
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      in_stack_ffffffffffffff80 = __x;
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::ub(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::ub(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      in_stack_ffffffffffffff90 =
           FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::sol_feas_tol((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)(in_RDI + -0x250));
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::sol_feas_tol_rel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)(in_RDI + -0x250));
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::GetModel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)(in_RDI + -0x250));
      FlatModel<mp::DefaultFlatModelParams>::var_name
                (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      viol_00.valX_ = in_stack_ffffffffffffff90;
      viol_00.viol_ = (double)in_stack_ffffffffffffff88;
      ViolSummary::CheckViol
                ((ViolSummary *)in_stack_ffffffffffffff80,viol_00,epsabs,epsrel,(char *)nm);
      bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::is_var_integer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      if (bVar1) {
        SolCheck::VarViolIntty(in_RSI);
        in_stack_ffffffffffffff58 =
             std::array<mp::ViolSummary,_2UL>::at
                       ((array<mp::ViolSummary,_2UL> *)in_stack_ffffffffffffff50,
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        in_stack_ffffffffffffff50 = __x;
        round((double)__x);
        round((double)__x);
        in_stack_ffffffffffffff60 =
             (FlatModel<mp::DefaultFlatModelParams> *)
             FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::sol_int_tol((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)(in_RDI + -0x250));
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::GetModel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)(in_RDI + -0x250));
        FlatModel<mp::DefaultFlatModelParams>::var_name
                  (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        viol_01.valX_ = in_stack_ffffffffffffff90;
        viol_01.viol_ = (double)in_stack_ffffffffffffff88;
        ViolSummary::CheckViol
                  ((ViolSummary *)in_stack_ffffffffffffff80,viol_01,epsabs,epsrel,(char *)nm);
      }
    }
  }
  return;
}

Assistant:

void CheckVars(SolCheck& chk) {
    for (auto i=MPCD( num_vars() ); i--; ) {
      auto x = chk.x(i);
      bool aux = !MPCD( is_var_original(i) );
      // no aux vars for idealistic mode
      if (!aux || !chk.if_recomputed()) {
        chk.VarViolBnds().at(aux).CheckViol(
              {MPCD( lb(i) ) - x, MPCD( lb(i) )},
              MPCD( sol_feas_tol() ), MPCD( sol_feas_tol_rel() ),
              MPCD( GetModel() ).var_name(i));
        chk.VarViolBnds().at(aux).CheckViol(
              {x - MPCD( ub(i) ), MPCD( ub(i) )},
              MPCD( sol_feas_tol() ), MPCD( sol_feas_tol_rel() ),
              MPCD( GetModel() ).var_name(i));
        if (MPCD( is_var_integer(i) ))
          chk.VarViolIntty().at(aux).CheckViol(
                { std::fabs(x - std::round(x)),
                  std::round(x) },
                MPCD( sol_int_tol() ), INFINITY,
                MPCD( GetModel() ).var_name(i));
      }
    }
  }